

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O0

void * mpp_dec_advanced_thread(void *data)

{
  MppDecImpl *dec_00;
  MppBufSlots slots;
  MppBufSlots slots_00;
  mpp_list *this;
  MppPacket pvVar1;
  MppThreadStatus MVar2;
  MPP_RET MVar3;
  RK_U32 RVar4;
  MppFrameFormat v;
  Mutex *mutex;
  MppBuffer pvVar5;
  size_t v_00;
  MppMeta meta_00;
  RK_S64 RVar6;
  __sighandler_t __handler;
  MppPacket *data_00;
  MppMeta meta_1;
  mpp_list *list;
  MppFrame tmp;
  MppFrame tmp_1;
  size_t buffer_size;
  size_t slot_size;
  MppBuffer output_buffer;
  MppBuffer input_buffer;
  MppMeta meta;
  undefined1 local_148 [8];
  AutoMutex autolock;
  MppPacket packet;
  MppFrame frame;
  MppTask pvStack_120;
  MPP_RET ret;
  MppTask mpp_task;
  MppPort output;
  MppPort input;
  HalDecTask *task_dec;
  DecTask *pTask;
  DecTask task;
  MppThread *thd_dec;
  MppBufSlots packet_slots;
  MppBufSlots frame_slots;
  MppDecImpl *dec;
  Mpp *mpp;
  void *data_local;
  
  dec_00 = *(MppDecImpl **)((long)data + 0xa8);
  slots = dec_00->frame_slots;
  slots_00 = dec_00->packet_slots;
  task.hal_frm_buf_out = dec_00->thread_parser;
  task_dec = (HalDecTask *)&pTask;
  dec_task_init((DecTask *)task_dec);
  input = &task_dec->syntax;
  output = *(MppPort *)((long)data + 0x60);
  mpp_task = *(MppTask *)((long)data + 0x68);
  pvStack_120 = (MppTask)0x0;
  frame._4_4_ = MPP_OK;
  packet = (MppPacket)0x0;
  autolock.mLock = (Mutex *)0x0;
  do {
    while( true ) {
      while( true ) {
        mutex = MppThread::mutex((MppThread *)task.hal_frm_buf_out,THREAD_WORK);
        Mutex::Autolock::Autolock((Autolock *)local_148,mutex,1);
        MVar2 = MppThread::get_status((MppThread *)task.hal_frm_buf_out,THREAD_WORK);
        if (MVar2 == MPP_THREAD_RUNNING) {
          MVar3 = check_task_wait(dec_00,(DecTask *)&pTask);
          if (MVar3 != MPP_OK) {
            MppThread::wait((MppThread *)task.hal_frm_buf_out,(void *)0x0);
          }
          meta._4_4_ = 0;
        }
        else {
          meta._4_4_ = 3;
        }
        Mutex::Autolock::~Autolock((Autolock *)local_148);
        if (meta._4_4_ != 0) {
          dec_release_task_in_port(output);
          dec_release_task_in_port(*(MppPort *)((long)data + 0x50));
          dec_release_task_in_port(*(MppPort *)((long)data + 0x58));
          return (void *)0x0;
        }
        if (dec_00->cmd_send == dec_00->cmd_recv) break;
        if ((mpp_dec_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_dec","ctrl proc %d cmd %08x\n","mpp_dec_advanced_thread",
                     (ulong)dec_00->cmd_recv,(ulong)dec_00->cmd);
        }
        sem_wait((sem_t *)&dec_00->cmd_start);
        MVar3 = mpp_dec_proc_cfg(dec_00,dec_00->cmd,dec_00->param);
        *dec_00->cmd_ret = MVar3;
        dec_00->cmd_recv = dec_00->cmd_recv + 1;
        if ((mpp_dec_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_dec","ctrl proc %d done send %d\n","mpp_dec_advanced_thread",
                     (ulong)dec_00->cmd_recv,(ulong)dec_00->cmd_send);
        }
        if ((dec_00->cmd_send != dec_00->cmd_send) &&
           (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "dec->cmd_send == dec->cmd_send","mpp_dec_advanced_thread",0x3b6),
           (mpp_debug & 0x10000000) != 0)) {
          abort();
        }
        dec_00->param = (void *)0x0;
        dec_00->cmd = 0;
        dec_00->cmd_ret = (MPP_RET *)0x0;
        sem_post((sem_t *)&dec_00->cmd_done);
      }
      if ((mpp_dec_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_dec","mpp_pkt_in_rdy %d\n","mpp_dec_advanced_thread",
                   (ulong)((ushort)task.hnd >> 1 & 1));
      }
      if (((ushort)task.hnd >> 1 & 1) == 0) break;
LAB_00151720:
      if ((mpp_dec_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_dec","task in ready\n","mpp_dec_advanced_thread");
      }
      if ((pvStack_120 == (MppTask)0x0) &&
         (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"mpp_task",
                     "mpp_dec_advanced_thread",0x3d1), (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      mpp_task_meta_get_packet(pvStack_120,KEY_INPUT_PACKET,&autolock.mLock);
      mpp_task_meta_get_frame(pvStack_120,KEY_OUTPUT_FRAME,&packet);
      if ((((packet == (MppPacket)0x0) && (autolock.mLock != (Mutex *)0x0)) &&
          (input_buffer = mpp_packet_get_meta(autolock.mLock), input_buffer != (MppMeta)0x0)) &&
         (mpp_meta_get_frame(input_buffer,KEY_OUTPUT_FRAME,&packet), packet != (MppPacket)0x0)) {
        task.hnd._0_2_ = (ushort)task.hnd & 0xfbff | 0x400;
      }
      if ((autolock.mLock == (Mutex *)0x0) || (packet == (MppPacket)0x0)) {
        _mpp_port_enqueue("mpp_dec_advanced_thread",output,pvStack_120);
        task.hnd._0_2_ = (ushort)task.hnd & 0xfffd;
      }
      else {
        pvVar5 = mpp_packet_get_buffer(autolock.mLock);
        if (pvVar5 == (MppBuffer)0x0) {
          _mpp_log_l(4,"mpp_dec","line(%d): Error! Get no buffer from input packet\n",
                     "mpp_dec_advanced_thread",0x43d);
          mpp_frame_init(&packet);
          mpp_frame_set_errinfo(packet,1);
        }
        else {
          output_buffer = mpp_packet_get_buffer(autolock.mLock);
          slot_size = (size_t)mpp_frame_get_buffer(packet);
          mpp_parser_prepare(dec_00->parser,autolock.mLock,(HalDecTask *)input);
          if (((*(ulong *)((long)input + 8) & 1) == 0) || (*input != 0)) {
            if (*(int *)((long)input + 0x2c) < 0) {
              mpp_buf_slot_get_unused(slots_00,(RK_S32 *)((long)input + 0x2c));
            }
            mpp_buf_slot_set_prop
                      (slots_00,*(RK_S32 *)((long)input + 0x2c),SLOT_BUFFER,output_buffer);
            mpp_buf_slot_set_flag(slots_00,*(RK_S32 *)((long)input + 0x2c),SLOT_CODEC_READY);
            mpp_buf_slot_set_flag(slots_00,*(RK_S32 *)((long)input + 0x2c),SLOT_HAL_INPUT);
            frame._4_4_ = mpp_parser_parse(dec_00->parser,(HalDecTask *)input);
            if (frame._4_4_ == MPP_OK) {
              if ((mpp_dec_debug & 0x20) != 0) {
                RVar4 = mpp_buf_slot_is_changed(slots);
                _mpp_log_l(4,"mpp_dec","slot change %d\n","mpp_dec_advanced_thread",(ulong)RVar4);
              }
              RVar4 = mpp_buf_slot_is_changed(slots);
              if (RVar4 != 0) {
                buffer_size = mpp_buf_slot_get_size(slots);
                tmp_1 = (MppFrame)
                        mpp_buffer_get_size_with_caller
                                  ((MppBuffer)slot_size,"mpp_dec_advanced_thread");
                if ((mpp_dec_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_dec","change size required %d vs input %d\n",
                             "mpp_dec_advanced_thread",buffer_size,tmp_1);
                }
                if ((MppFrame)buffer_size == tmp_1) {
                  mpp_buf_slot_ready(slots);
                }
                if ((tmp_1 < buffer_size) &&
                   (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                               "slot_size <= buffer_size","mpp_dec_advanced_thread",0x415),
                   (mpp_debug & 0x10000000) != 0)) {
                  abort();
                }
                if (tmp_1 < buffer_size) {
                  _mpp_log_l(2,"mpp_dec",
                             "required buffer size %d is larger than input buffer size %d\n",
                             "mpp_dec_advanced_thread",buffer_size,tmp_1);
                }
              }
              mpp_buf_slot_set_prop
                        (slots,*(RK_S32 *)((long)input + 0x34),SLOT_BUFFER,(void *)slot_size);
              if ((dec_00->info_updated == 0) && (dec_00->dev != (MppDev)0x0)) {
                tmp = (MppFrame)0x0;
                mpp_buf_slot_get_prop(slots,*(RK_S32 *)((long)input + 0x34),SLOT_FRAME_PTR,&tmp);
                update_dec_hal_info(dec_00,tmp);
                dec_00->info_updated = 1;
              }
              mpp_hal_reg_gen(dec_00->hal,(HalTaskInfo *)&task_dec->syntax);
              mpp_hal_hw_start(dec_00->hal,(HalTaskInfo *)&task_dec->syntax);
              mpp_hal_hw_wait(dec_00->hal,(HalTaskInfo *)&task_dec->syntax);
              list = (mpp_list *)0x0;
              mpp_buf_slot_get_prop(slots,*(RK_S32 *)((long)input + 0x34),SLOT_FRAME_PTR,&list);
              pvVar1 = packet;
              RVar4 = mpp_frame_get_width(list);
              mpp_frame_set_width(pvVar1,RVar4);
              pvVar1 = packet;
              RVar4 = mpp_frame_get_height(list);
              mpp_frame_set_height(pvVar1,RVar4);
              pvVar1 = packet;
              RVar4 = mpp_frame_get_hor_stride(list);
              mpp_frame_set_hor_stride(pvVar1,RVar4);
              pvVar1 = packet;
              RVar4 = mpp_frame_get_ver_stride(list);
              mpp_frame_set_ver_stride(pvVar1,RVar4);
              pvVar1 = packet;
              RVar4 = mpp_frame_get_hor_stride_pixel(list);
              mpp_frame_set_hor_stride_pixel(pvVar1,RVar4);
              pvVar1 = packet;
              RVar6 = mpp_frame_get_pts(list);
              mpp_frame_set_pts(pvVar1,RVar6);
              pvVar1 = packet;
              v = mpp_frame_get_fmt(list);
              mpp_frame_set_fmt(pvVar1,v);
              pvVar1 = packet;
              RVar4 = mpp_frame_get_errinfo(list);
              mpp_frame_set_errinfo(pvVar1,RVar4);
              pvVar1 = packet;
              v_00 = mpp_frame_get_buf_size(list);
              mpp_frame_set_buf_size(pvVar1,v_00);
              mpp_buf_slot_clr_flag(slots_00,*(RK_S32 *)((long)input + 0x2c),SLOT_HAL_INPUT);
              mpp_buf_slot_clr_flag(slots,*(RK_S32 *)((long)input + 0x34),SLOT_HAL_OUTPUT);
            }
            else {
              _mpp_log_l(2,"mpp_dec","something wrong with mpp_parser_parse!\n",
                         "mpp_dec_advanced_thread");
              mpp_frame_set_errinfo(packet,1);
              mpp_buf_slot_clr_flag(slots_00,*(RK_S32 *)((long)input + 0x2c),SLOT_HAL_INPUT);
            }
          }
          else {
            mpp_frame_set_eos(packet,1);
          }
        }
        if (((ushort)task.hnd >> 10 & 1) == 0) {
          mpp_task_meta_set_packet(pvStack_120,KEY_INPUT_PACKET,autolock.mLock);
          _mpp_port_enqueue("mpp_dec_advanced_thread",output,pvStack_120);
          pvStack_120 = (MppTask)0x0;
          _mpp_port_poll("mpp_dec_advanced_thread",mpp_task,MPP_POLL_BLOCK);
          _mpp_port_dequeue("mpp_dec_advanced_thread",mpp_task,&stack0xfffffffffffffee0);
          mpp_task_meta_set_frame(pvStack_120,KEY_OUTPUT_FRAME,packet);
          pvVar5 = mpp_frame_get_buffer(packet);
          mpp_buffer_sync_begin_f(pvVar5,1,"mpp_dec_advanced_thread");
          _mpp_port_enqueue("mpp_dec_advanced_thread",mpp_task,pvStack_120);
        }
        else {
          this = *(mpp_list **)((long)data + 0x18);
          meta_00 = mpp_frame_get_meta(packet);
          if (meta_00 != (MppMeta)0x0) {
            mpp_meta_set_packet(meta_00,KEY_INPUT_PACKET,autolock.mLock);
          }
          if ((mpp_debug & 2) != 0) {
            RVar6 = mpp_frame_get_pts(packet);
            _mpp_log_l(4,"mpp_dec","output frame pts %lld\n",(char *)0x0,RVar6);
          }
          MppMutexCond::lock(&this->super_MppMutexCond);
          data_00 = &packet;
          mpp_list::add_at_tail(this,data_00,8);
          *(int *)((long)data + 0x28) = *(int *)((long)data + 0x28) + 1;
          MppMutexCond::signal(&this->super_MppMutexCond,(int)data_00,__handler);
          MppMutexCond::unlock(&this->super_MppMutexCond);
          _mpp_port_enqueue("mpp_dec_advanced_thread",output,pvStack_120);
          task.hnd._0_2_ = (ushort)task.hnd & 0xfbff;
        }
        pvStack_120 = (MppTask)0x0;
        autolock.mLock = (Mutex *)0x0;
        packet = (MppPacket)0x0;
        dec_task_info_init((HalTaskInfo *)&task_dec->syntax);
        task.hnd._0_2_ = (ushort)task.hnd & 0xfffd;
      }
    }
    frame._4_4_ = _mpp_port_poll("mpp_dec_advanced_thread",output,MPP_POLL_NON_BLOCK);
    if (MPP_NOK < frame._4_4_) {
      if ((mpp_dec_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_dec","poll ready\n","mpp_dec_advanced_thread");
      }
      task.hnd._0_2_ = (ushort)task.hnd & 0xfffd | 2;
      task.hnd._4_2_ = task.hnd._4_2_ & 0xfffe;
      frame._4_4_ = _mpp_port_dequeue("mpp_dec_advanced_thread",output,&stack0xfffffffffffffee0);
      if ((frame._4_4_ != MPP_OK) &&
         (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"ret == MPP_OK",
                     "mpp_dec_advanced_thread",0x3cd), (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      goto LAB_00151720;
    }
    task.hnd._4_2_ = task.hnd._4_2_ & 0xfffe | 1;
  } while( true );
}

Assistant:

void *mpp_dec_advanced_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppBufSlots frame_slots = dec->frame_slots;
    MppBufSlots packet_slots = dec->packet_slots;
    MppThread *thd_dec  = dec->thread_parser;
    DecTask task;   /* decoder task */
    DecTask *pTask = &task;
    dec_task_init(pTask);
    HalDecTask  *task_dec = &pTask->info.dec;
    MppPort input  = mpp->mMppInPort;
    MppPort output = mpp->mMppOutPort;
    MppTask mpp_task = NULL;
    MPP_RET ret = MPP_OK;
    MppFrame frame = NULL;
    MppPacket packet = NULL;

    while (1) {
        {
            AutoMutex autolock(thd_dec->mutex());
            if (MPP_THREAD_RUNNING != thd_dec->get_status())
                break;

            if (check_task_wait(dec, &task))
                thd_dec->wait();
        }

        // process user control
        if (dec->cmd_send != dec->cmd_recv) {
            dec_dbg_detail("ctrl proc %d cmd %08x\n", dec->cmd_recv, dec->cmd);
            sem_wait(&dec->cmd_start);
            *dec->cmd_ret = mpp_dec_proc_cfg(dec, dec->cmd, dec->param);
            dec->cmd_recv++;
            dec_dbg_detail("ctrl proc %d done send %d\n", dec->cmd_recv,
                           dec->cmd_send);
            mpp_assert(dec->cmd_send == dec->cmd_send);
            dec->param = NULL;
            dec->cmd = (MpiCmd)0;
            dec->cmd_ret = NULL;
            sem_post(&dec->cmd_done);
            continue;
        }

        // 1. check task in
        dec_dbg_detail("mpp_pkt_in_rdy %d\n", task.status.mpp_pkt_in_rdy);
        if (!task.status.mpp_pkt_in_rdy) {
            ret = mpp_port_poll(input, MPP_POLL_NON_BLOCK);
            if (ret < 0) {
                task.wait.dec_pkt_in = 1;
                continue;
            }

            dec_dbg_detail("poll ready\n");

            task.status.mpp_pkt_in_rdy = 1;
            task.wait.dec_pkt_in = 0;

            ret = mpp_port_dequeue(input, &mpp_task);
            mpp_assert(ret == MPP_OK);
        }
        dec_dbg_detail("task in ready\n");

        mpp_assert(mpp_task);

        mpp_task_meta_get_packet(mpp_task, KEY_INPUT_PACKET, &packet);
        mpp_task_meta_get_frame (mpp_task, KEY_OUTPUT_FRAME,  &frame);

        if (!frame && packet) {
            MppMeta meta = mpp_packet_get_meta(packet);

            if (meta) {
                mpp_meta_get_frame(meta, KEY_OUTPUT_FRAME, &frame);
                if (frame)
                    task.status.mpp_in_frm_at_pkt = 1;
            }
        }

        if (NULL == packet || NULL == frame) {
            mpp_port_enqueue(input, mpp_task);
            task.status.mpp_pkt_in_rdy = 0;
            continue;
        }

        if (mpp_packet_get_buffer(packet)) {
            /*
             * if there is available buffer in the input packet do decoding
             */
            MppBuffer input_buffer = mpp_packet_get_buffer(packet);
            MppBuffer output_buffer = mpp_frame_get_buffer(frame);

            mpp_parser_prepare(dec->parser, packet, task_dec);

            /*
             * We may find eos in prepare step and there will be no anymore vaild task generated.
             * So here we try push eos task to hal, hal will push all frame to display then
             * push a eos frame to tell all frame decoded
             */
            if (task_dec->flags.eos && !task_dec->valid) {
                mpp_frame_set_eos(frame, 1);
                goto DEC_OUT;
            }

            /*
             *  look for a unused packet slot index
             */
            if (task_dec->input < 0) {
                mpp_buf_slot_get_unused(packet_slots, &task_dec->input);
            }
            mpp_buf_slot_set_prop(packet_slots, task_dec->input, SLOT_BUFFER, input_buffer);
            mpp_buf_slot_set_flag(packet_slots, task_dec->input, SLOT_CODEC_READY);
            mpp_buf_slot_set_flag(packet_slots, task_dec->input, SLOT_HAL_INPUT);

            ret = mpp_parser_parse(dec->parser, task_dec);
            if (ret != MPP_OK) {
                mpp_err_f("something wrong with mpp_parser_parse!\n");
                mpp_frame_set_errinfo(frame, 1); /* 0 - OK; 1 - error */
                mpp_buf_slot_clr_flag(packet_slots, task_dec->input,  SLOT_HAL_INPUT);
                goto DEC_OUT;
            }

            dec_dbg_detail("slot change %d\n", mpp_buf_slot_is_changed(frame_slots));
            if (mpp_buf_slot_is_changed(frame_slots)) {
                size_t slot_size = mpp_buf_slot_get_size(frame_slots);
                size_t buffer_size = mpp_buffer_get_size(output_buffer);

                dec_dbg_detail("change size required %d vs input %d\n", slot_size, buffer_size);
                if (slot_size == buffer_size) {
                    mpp_buf_slot_ready(frame_slots);
                }

                mpp_assert(slot_size <= buffer_size);

                if (slot_size > buffer_size) {
                    mpp_err_f("required buffer size %d is larger than input buffer size %d\n",
                              slot_size, buffer_size);
                }
            }

            mpp_buf_slot_set_prop(frame_slots, task_dec->output, SLOT_BUFFER, output_buffer);
            // update codec info
            if (!dec->info_updated && dec->dev) {
                MppFrame tmp = NULL;

                mpp_buf_slot_get_prop(frame_slots, task_dec->output, SLOT_FRAME_PTR, &tmp);
                update_dec_hal_info(dec, tmp);
                dec->info_updated = 1;
            }
            // register genertation
            mpp_hal_reg_gen(dec->hal, &pTask->info);
            mpp_hal_hw_start(dec->hal, &pTask->info);
            mpp_hal_hw_wait(dec->hal, &pTask->info);

            MppFrame tmp = NULL;
            mpp_buf_slot_get_prop(frame_slots, task_dec->output, SLOT_FRAME_PTR, &tmp);
            mpp_frame_set_width(frame, mpp_frame_get_width(tmp));
            mpp_frame_set_height(frame, mpp_frame_get_height(tmp));
            mpp_frame_set_hor_stride(frame, mpp_frame_get_hor_stride(tmp));
            mpp_frame_set_ver_stride(frame, mpp_frame_get_ver_stride(tmp));
            mpp_frame_set_hor_stride_pixel(frame, mpp_frame_get_hor_stride_pixel(tmp));
            mpp_frame_set_pts(frame, mpp_frame_get_pts(tmp));
            mpp_frame_set_fmt(frame, mpp_frame_get_fmt(tmp));
            mpp_frame_set_errinfo(frame, mpp_frame_get_errinfo(tmp));
            mpp_frame_set_buf_size(frame, mpp_frame_get_buf_size(tmp));

            mpp_buf_slot_clr_flag(packet_slots, task_dec->input,  SLOT_HAL_INPUT);
            mpp_buf_slot_clr_flag(frame_slots, task_dec->output, SLOT_HAL_OUTPUT);
        } else {
            /*
             * else init a empty frame for output
             */
            mpp_log_f("line(%d): Error! Get no buffer from input packet\n", __LINE__);
            mpp_frame_init(&frame);
            mpp_frame_set_errinfo(frame, 1);
        }

        /*
         * first clear output packet
         * then enqueue task back to input port
         * final user will release the mpp_frame they had input
         */
    DEC_OUT:
        if (task.status.mpp_in_frm_at_pkt) {
            mpp_list *list = mpp->mFrmOut;
            MppMeta meta = mpp_frame_get_meta(frame);

            if (meta)
                mpp_meta_set_packet(meta, KEY_INPUT_PACKET, packet);

            mpp_dbg_pts("output frame pts %lld\n", mpp_frame_get_pts(frame));

            list->lock();
            list->add_at_tail(&frame, sizeof(frame));
            mpp->mFramePutCount++;
            list->signal();
            list->unlock();

            mpp_port_enqueue(input, mpp_task);
            mpp_task = NULL;

            task.status.mpp_in_frm_at_pkt = 0;
        } else {
            mpp_task_meta_set_packet(mpp_task, KEY_INPUT_PACKET, packet);
            mpp_port_enqueue(input, mpp_task);
            mpp_task = NULL;

            // send finished task to output port
            mpp_port_poll(output, MPP_POLL_BLOCK);
            mpp_port_dequeue(output, &mpp_task);
            mpp_task_meta_set_frame(mpp_task, KEY_OUTPUT_FRAME, frame);
            mpp_buffer_sync_ro_begin(mpp_frame_get_buffer(frame));

            // setup output task here
            mpp_port_enqueue(output, mpp_task);
            mpp_task = NULL;
        }

        packet = NULL;
        frame = NULL;

        dec_task_info_init(&pTask->info);

        task.status.mpp_pkt_in_rdy = 0;
    }

    // clear remain task in output port
    dec_release_task_in_port(input);
    dec_release_task_in_port(mpp->mUsrInPort);
    dec_release_task_in_port(mpp->mUsrOutPort);

    return NULL;
}